

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O3

btVectorXf * __thiscall
btLemkeAlgorithm::solve(btVectorXf *__return_storage_ptr__,btLemkeAlgorithm *this,uint maxloops)

{
  float fVar1;
  uint rows;
  bool bVar2;
  undefined1 auVar3 [16];
  int *piVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  undefined4 uVar8;
  float *pfVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int *ptr;
  btLemkeAlgorithm *pbVar13;
  btAlignedObjectArray<int> *in_R8;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  btAlignedObjectArray<int> basis;
  btMatrixXf A;
  btMatrixXf ident;
  btMatrixXf mNeg;
  btAlignedObjectArray<int> local_170;
  ulong local_150;
  btVectorXf *local_148;
  uint local_140;
  uint local_13c;
  btMatrixX<float> local_138;
  btMatrixX<float> local_e0;
  btMatrixX<float> local_88;
  long lVar23;
  
  *(undefined4 *)(this + 0x80) = 0;
  rows = *(uint *)(this + 100);
  uVar14 = (long)(int)rows * 2;
  btVectorX<float>::btVectorX(__return_storage_ptr__,(int)uVar14);
  lVar10 = (long)(__return_storage_ptr__->m_storage).m_size;
  if (lVar10 != 0) {
    memset((__return_storage_ptr__->m_storage).m_data,0,lVar10 << 2);
  }
  local_148 = __return_storage_ptr__;
  btMatrixX<float>::btMatrixX(&local_e0,rows,rows);
  btMatrixX<float>::setIdentity(&local_e0);
  btMatrixX<float>::negative(&local_88,(btMatrixX<float> *)(this + 8));
  btMatrixX<float>::btMatrixX(&local_138,rows,(int)uVar14 + 2);
  if (0 < (long)local_e0.m_rows) {
    in_R8 = (btAlignedObjectArray<int> *)(ulong)(uint)local_138.m_setElemOperations;
    lVar10 = 0;
    pfVar9 = local_138.m_storage.m_data;
    do {
      if (0 < local_e0.m_cols) {
        uVar15 = 0;
        do {
          pfVar9[uVar15] = local_e0.m_storage.m_data[uVar15];
          uVar15 = uVar15 + 1;
        } while ((uint)local_e0.m_cols != uVar15);
        local_138.m_setElemOperations = (int)in_R8 + local_e0.m_cols;
        in_R8 = (btAlignedObjectArray<int> *)(ulong)(uint)local_138.m_setElemOperations;
      }
      lVar10 = lVar10 + 1;
      pfVar9 = pfVar9 + local_138.m_cols;
      local_e0.m_storage.m_data = local_e0.m_storage.m_data + local_e0.m_cols;
    } while (lVar10 != local_e0.m_rows);
  }
  if (0 < (long)local_88.m_rows) {
    pfVar9 = local_138.m_storage.m_data + (int)rows;
    in_R8 = (btAlignedObjectArray<int> *)((long)local_88.m_cols * 4);
    lVar10 = 0;
    uVar12 = local_138.m_setElemOperations;
    do {
      if (0 < local_88.m_cols) {
        uVar15 = 0;
        do {
          pfVar9[uVar15] = local_88.m_storage.m_data[uVar15];
          uVar15 = uVar15 + 1;
        } while ((uint)local_88.m_cols != uVar15);
        uVar12 = uVar12 + local_88.m_cols;
        local_138.m_setElemOperations = uVar12;
      }
      lVar10 = lVar10 + 1;
      pfVar9 = pfVar9 + local_138.m_cols;
      local_88.m_storage.m_data = local_88.m_storage.m_data + local_88.m_cols;
    } while (lVar10 != local_88.m_rows);
  }
  auVar3 = _DAT_001ee270;
  if (0 < (int)rows) {
    lVar10 = (long)local_138.m_cols;
    pfVar9 = local_138.m_storage.m_data + (uVar14 & 0xffffffff);
    uVar15 = (ulong)(rows + 3 & 0xfffffffc);
    pbVar13 = (btLemkeAlgorithm *)(ulong)rows + -1;
    auVar20._8_4_ = (int)pbVar13;
    auVar20._0_8_ = pbVar13;
    auVar20._12_4_ = (int)((ulong)pbVar13 >> 0x20);
    in_R8 = (btAlignedObjectArray<int> *)(lVar10 * 0x10);
    auVar20 = auVar20 ^ _DAT_001ee270;
    auVar22 = _DAT_001ee5c0;
    auVar24 = _DAT_001ee5d0;
    do {
      auVar25 = auVar24 ^ auVar3;
      iVar16 = auVar20._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar16 && auVar20._0_4_ < auVar25._0_4_ ||
                  iVar16 < auVar25._4_4_) & 1)) {
        *pfVar9 = -1.0;
      }
      if ((auVar25._12_4_ != auVar20._12_4_ || auVar25._8_4_ <= auVar20._8_4_) &&
          auVar25._12_4_ <= auVar20._12_4_) {
        pfVar9[lVar10] = -1.0;
      }
      auVar25 = auVar22 ^ auVar3;
      iVar19 = auVar25._4_4_;
      if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar25._0_4_ <= auVar20._0_4_)) {
        pfVar9[lVar10 * 2] = -1.0;
        pfVar9[lVar10 * 3] = -1.0;
      }
      lVar23 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar23 + 4;
      lVar23 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar23 + 4;
      pfVar9 = pfVar9 + lVar10 * 4;
      uVar15 = uVar15 - 4;
    } while (uVar15 != 0);
    local_138.m_setElemOperations = local_138.m_setElemOperations + rows;
  }
  uVar15 = uVar14 | 1;
  iVar16 = *(int *)(this + 100);
  if (0 < (long)iVar16) {
    lVar10 = *(long *)(this + 0x70);
    pfVar9 = local_138.m_storage.m_data + uVar15;
    in_R8 = (btAlignedObjectArray<int> *)0x0;
    do {
      *pfVar9 = *(float *)(lVar10 + (long)in_R8 * 4);
      in_R8 = (btAlignedObjectArray<int> *)((long)in_R8 + 1);
      pfVar9 = pfVar9 + local_138.m_cols;
    } while ((btAlignedObjectArray<int> *)(long)iVar16 != in_R8);
    local_138.m_setElemOperations = local_138.m_setElemOperations + iVar16;
  }
  uVar7 = 0;
  local_170.m_ownsMemory = true;
  local_170.m_data = (int *)0x0;
  local_170.m_size = 0;
  local_170.m_capacity = 0;
  if ((int)rows < 1) {
LAB_001d1548:
    if (0 < (int)uVar7) {
      pfVar9 = (local_148->m_storage).m_data;
      local_138.m_storage.m_data = local_138.m_storage.m_data + (int)uVar15;
      uVar8 = 0;
      uVar14 = 0;
      do {
        pfVar9[local_170.m_data[uVar14]] = *local_138.m_storage.m_data;
        uVar14 = uVar14 + 1;
        local_138.m_storage.m_data = local_138.m_storage.m_data + local_138.m_cols;
      } while ((uVar7 & 0xffffffff) != uVar14);
      goto LAB_001d15f6;
    }
  }
  else {
    ptr = (int *)0x0;
    uVar7 = 0;
    uVar12 = 0;
    local_150 = uVar15;
    do {
      local_170.m_ownsMemory = true;
      uVar17 = (uint)uVar7;
      piVar6 = ptr;
      piVar4 = local_170.m_data;
      uVar5 = local_170.m_capacity;
      if (uVar17 == local_170.m_capacity) {
        uVar11 = uVar17 * 2;
        if (uVar17 == 0) {
          uVar11 = 1;
        }
        if ((int)uVar17 < (int)uVar11) {
          if (uVar11 == 0) {
            piVar6 = (int *)0x0;
          }
          else {
            piVar6 = (int *)btAlignedAllocInternal((long)(int)uVar11 << 2,0x10);
            uVar7 = (ulong)(uint)local_170.m_size;
            ptr = local_170.m_data;
          }
          piVar4 = piVar6;
          uVar5 = uVar11;
          if ((int)(uint)uVar7 < 1) {
            uVar17 = (uint)uVar7;
            if (ptr == (int *)0x0) goto LAB_001d141a;
          }
          else {
            uVar15 = 0;
            do {
              piVar6[uVar15] = ptr[uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
          }
          uVar17 = local_170.m_size;
          if (local_170.m_ownsMemory == true) {
            btAlignedFreeInternal(ptr);
            uVar17 = local_170.m_size;
          }
        }
      }
LAB_001d141a:
      local_170.m_capacity = uVar5;
      local_170.m_data = piVar4;
      ptr = piVar6;
      local_170.m_ownsMemory = true;
      ptr[(int)uVar17] = uVar12;
      local_170.m_size = local_170.m_size + 1;
      uVar7 = (ulong)(uint)local_170.m_size;
      uVar12 = uVar12 + 1;
    } while (uVar12 != rows);
    uVar15 = local_150;
    if ((int)rows < 1) goto LAB_001d1548;
    pfVar9 = local_138.m_storage.m_data + (local_150 & 0xffffffff);
    uVar18 = 0xffffffff;
    fVar21 = 1e+30;
    bVar2 = true;
    pbVar13 = (btLemkeAlgorithm *)0x0;
    do {
      fVar1 = *pfVar9;
      if (fVar1 < fVar21) {
        uVar18 = (ulong)pbVar13 & 0xffffffff;
        fVar21 = fVar1;
      }
      in_R8 = (btAlignedObjectArray<int> *)CONCAT71((int7)((ulong)in_R8 >> 8),0.0 <= fVar1);
      bVar2 = (bool)(bVar2 & 0.0 <= fVar1);
      pbVar13 = pbVar13 + 1;
      pfVar9 = pfVar9 + local_138.m_cols;
    } while ((btLemkeAlgorithm *)(ulong)rows != pbVar13);
    if (bVar2) goto LAB_001d1548;
    local_140 = 100;
    if (maxloops != 0) {
      local_140 = maxloops;
    }
    *(undefined4 *)(this + 0x80) = 0;
    uVar12 = (uint)uVar18;
    do {
      iVar16 = (int)uVar14;
      iVar19 = (int)uVar18;
      GaussJordanEliminationStep(pbVar13,&local_138,iVar19,iVar16,in_R8);
      uVar17 = -rows;
      if (local_170.m_data[iVar19] < (int)rows) {
        uVar17 = rows;
      }
      uVar17 = uVar17 + local_170.m_data[iVar19];
      uVar14 = (ulong)uVar17;
      local_170.m_data[iVar19] = iVar16;
      pbVar13 = this;
      local_13c = uVar17;
      uVar5 = findLexicographicMinimum(this,&local_138,(int *)&local_13c);
      uVar18 = (ulong)uVar5;
      if (uVar12 == uVar5) {
        GaussJordanEliminationStep(pbVar13,&local_138,uVar12,uVar17,in_R8);
        local_170.m_data[(int)uVar12] = uVar17;
        break;
      }
      iVar16 = *(int *)(this + 0x80);
      *(uint *)(this + 0x80) = iVar16 + 1U;
    } while (iVar16 + 1U < local_140);
    uVar7 = (ulong)local_170.m_size;
    if (0 < (long)uVar7) {
      uVar8 = 0xffffffff;
      if (SBORROW4(*local_170.m_data,local_170.m_size * 2) ==
          *local_170.m_data + local_170.m_size * -2 < 0) goto LAB_001d15f6;
      uVar14 = 1;
      do {
        uVar18 = uVar14;
        if (uVar7 == uVar18) break;
        uVar14 = uVar18 + 1;
      } while (SBORROW4(local_170.m_data[uVar18],local_170.m_size * 2) !=
               local_170.m_data[uVar18] + local_170.m_size * -2 < 0);
      uVar15 = local_150;
      if (uVar18 < uVar7) goto LAB_001d15f6;
      goto LAB_001d1548;
    }
  }
  uVar8 = 0;
LAB_001d15f6:
  *(undefined4 *)(this + 0x88) = uVar8;
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_170);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_138.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_138.m_storage);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_88.m_storage);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_e0.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_e0.m_storage);
  return local_148;
}

Assistant:

btVectorXu btLemkeAlgorithm::solve(unsigned int maxloops /* = 0*/)
{
  
    
    steps = 0;

    int dim = m_q.size();
#ifdef BT_DEBUG_OSTREAM
    if(DEBUGLEVEL >= 1) {
      cout << "Dimension = " << dim << endl;
    }
#endif //BT_DEBUG_OSTREAM

	btVectorXu solutionVector(2 * dim);
	solutionVector.setZero();
	  
	  //, INIT, 0.);

	btMatrixXu ident(dim, dim);
	ident.setIdentity();
#ifdef BT_DEBUG_OSTREAM
	cout << m_M << std::endl;
#endif

	btMatrixXu mNeg = m_M.negative();
	  
    btMatrixXu A(dim, 2 * dim + 2);
	//
	A.setSubMatrix(0, 0, dim - 1, dim - 1,ident);
	A.setSubMatrix(0, dim, dim - 1, 2 * dim - 1,mNeg);
	A.setSubMatrix(0, 2 * dim, dim - 1, 2 * dim, -1.f);
	A.setSubMatrix(0, 2 * dim + 1, dim - 1, 2 * dim + 1,m_q);

#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //BT_DEBUG_OSTREAM


 //   btVectorXu q_;
 //   q_ >> A(0, 2 * dim + 1, dim - 1, 2 * dim + 1);

    btAlignedObjectArray<int> basis;
    //At first, all w-values are in the basis
    for (int i = 0; i < dim; i++)
      basis.push_back(i);

	int pivotRowIndex = -1;
	btScalar minValue = 1e30f;
	bool greaterZero = true;
	for (int i=0;i<dim;i++)
	{
		btScalar v =A(i,2*dim+1);
		if (v<minValue)
		{
			minValue=v;
			pivotRowIndex = i;
		}
		if (v<0)
			greaterZero = false;
	}
	

	
  //  int pivotRowIndex = q_.minIndex();//minIndex(q_);     // first row is that with lowest q-value
    int z0Row = pivotRowIndex;           // remember the col of z0 for ending algorithm afterwards
    int pivotColIndex = 2 * dim;         // first col is that of z0

#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 3)
	{
    //  cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
      cout << "Basis: ";
      for (int i = 0; i < basis.size(); i++)
        cout << basis[i] << " ";
      cout << endl;
    }
#endif //BT_DEBUG_OSTREAM

	if (!greaterZero)
	{

      if (maxloops == 0) {
		  maxloops = 100;
//        maxloops = UINT_MAX; //TODO: not a really nice way, problem is: maxloops should be 2^dim (=1<<dim), but this could exceed UINT_MAX and thus the result would be 0 and therefore the lemke algorithm wouldn't start but probably would find a solution within less then UINT_MAX steps. Therefore this constant is used as a upper border right now...
      }

      /*start looping*/
      for(steps = 0; steps < maxloops; steps++) {

        GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
#ifdef BT_DEBUG_OSTREAM
        if (DEBUGLEVEL >= 3) {
        //  cout << "A: " << A << endl;
          cout << "pivotRowIndex " << pivotRowIndex << endl;
          cout << "pivotColIndex " << pivotColIndex << endl;
          cout << "Basis: ";
          for (int i = 0; i < basis.size(); i++)
            cout << basis[i] << " ";
          cout << endl;
        }
#endif //BT_DEBUG_OSTREAM

        int pivotColIndexOld = pivotColIndex;

        /*find new column index */
        if (basis[pivotRowIndex] < dim) //if a w-value left the basis get in the correspondent z-value
          pivotColIndex = basis[pivotRowIndex] + dim;
        else
          //else do it the other way round and get in the corresponding w-value
          pivotColIndex = basis[pivotRowIndex] - dim;

        /*the column becomes part of the basis*/
        basis[pivotRowIndex] = pivotColIndexOld;

        pivotRowIndex = findLexicographicMinimum(A, pivotColIndex);

        if(z0Row == pivotRowIndex) { //if z0 leaves the basis the solution is found --> one last elimination step is necessary
          GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
          basis[pivotRowIndex] = pivotColIndex; //update basis
          break;
      }

      }
#ifdef BT_DEBUG_OSTREAM
      if(DEBUGLEVEL >= 1) {
        cout << "Number of loops: " << steps << endl;
        cout << "Number of maximal loops: " << maxloops << endl;
      }
#endif //BT_DEBUG_OSTREAM

      if(!validBasis(basis)) {
        info = -1;
#ifdef BT_DEBUG_OSTREAM
        if(DEBUGLEVEL >= 1)
          cerr << "Lemke-Algorithm ended with Ray-Termination (no valid solution)." << endl;
#endif //BT_DEBUG_OSTREAM

        return solutionVector;
      }

    }
#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 2) {
     // cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
    }
#endif //BT_DEBUG_OSTREAM

    for (int i = 0; i < basis.size(); i++)
	{
      solutionVector[basis[i]] = A(i,2*dim+1);//q_[i];
	}

    info = 0;

    return solutionVector;
  }